

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::DescribeToImpl
          (UnorderedElementsAreMatcherImplBase *this,ostream *os)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  const_reference ppMVar4;
  size_type sVar5;
  ostream *in_RSI;
  vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
  *in_RDI;
  size_t i;
  char *sep;
  vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
  *in_stack_ffffffffffffff90;
  ostream *in_stack_ffffffffffffffc0;
  size_type __n;
  size_t in_stack_ffffffffffffffc8;
  char *pcVar6;
  
  bVar1 = std::
          vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
          ::empty(in_stack_ffffffffffffff90);
  if (bVar1) {
    std::operator<<(in_RSI,"is empty");
  }
  else {
    sVar2 = std::
            vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
            ::size(in_RDI);
    if (sVar2 == 1) {
      std::operator<<(in_RSI,"has ");
      Elements(in_stack_ffffffffffffffc8);
      poVar3 = testing::operator<<(in_stack_ffffffffffffffc0,(Message *)in_RDI);
      std::operator<<(poVar3," and that element ");
      Message::~Message((Message *)0x16dd53);
      ppMVar4 = std::
                vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                ::operator[](in_RDI,0);
      (*(*ppMVar4)->_vptr_MatcherDescriberInterface[2])(*ppMVar4,in_RSI);
    }
    else {
      std::operator<<(in_RSI,"has ");
      std::
      vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
      ::size(in_RDI);
      Elements(in_stack_ffffffffffffffc8);
      poVar3 = testing::operator<<(in_stack_ffffffffffffffc0,(Message *)in_RDI);
      std::operator<<(poVar3," and there exists some permutation of elements such that:\n");
      Message::~Message((Message *)0x16ddf6);
      pcVar6 = "";
      sVar2 = 0;
      while( true ) {
        __n = sVar2;
        sVar5 = std::
                vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                ::size(in_RDI);
        if (sVar2 == sVar5) break;
        poVar3 = std::operator<<(in_RSI,pcVar6);
        poVar3 = std::operator<<(poVar3," - element #");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,__n);
        std::operator<<(poVar3," ");
        ppMVar4 = std::
                  vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                  ::operator[](in_RDI,__n);
        (*(*ppMVar4)->_vptr_MatcherDescriberInterface[2])(*ppMVar4,in_RSI);
        pcVar6 = ", and\n";
        sVar2 = __n + 1;
      }
    }
  }
  return;
}

Assistant:

void UnorderedElementsAreMatcherImplBase::DescribeToImpl(
    ::std::ostream* os) const {
  if (matcher_describers_.empty()) {
    *os << "is empty";
    return;
  }
  if (matcher_describers_.size() == 1) {
    *os << "has " << Elements(1) << " and that element ";
    matcher_describers_[0]->DescribeTo(os);
    return;
  }
  *os << "has " << Elements(matcher_describers_.size())
      << " and there exists some permutation of elements such that:\n";
  const char* sep = "";
  for (size_t i = 0; i != matcher_describers_.size(); ++i) {
    *os << sep << " - element #" << i << " ";
    matcher_describers_[i]->DescribeTo(os);
    sep = ", and\n";
  }
}